

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void predict_or_learn<false,false,false,false>(oaa *o,single_learner *base,example *ec)

{
  ostream *poVar1;
  float *pfVar2;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i_1;
  uint32_t i;
  v_array<float> scores_array;
  uint32_t prediction;
  stringstream outputStringStream;
  label_t mc_label_data;
  float fVar3;
  uint uVar4;
  undefined4 in_stack_fffffffffffffe14;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 uVar5;
  size_t in_stack_fffffffffffffe30;
  example *in_stack_fffffffffffffe38;
  learner<char,_example> *in_stack_fffffffffffffe40;
  uint local_1ac;
  stringstream local_1a8 [392];
  ulong local_20;
  long local_18;
  ulong *local_8;
  
  local_20 = *(ulong *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((uint)local_20 == 0) || ((*in_RDI < (local_20 & 0xffffffff) && ((uint)local_20 != -1)))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"label ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)local_20);
    poVar1 = std::operator<<(poVar1," is not in {1,");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
    poVar1 = std::operator<<(poVar1,"} This won\'t work right.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = 1;
  uVar5 = 0x7f7fffff;
  *(undefined4 *)(local_18 + 0x6830) = 0;
  *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
  LEARNER::learner<char,_example>::multipredict
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,0,
             (polyprediction *)CONCAT44(0x7f7fffff,in_stack_fffffffffffffe20),
             (bool)in_stack_fffffffffffffe1f);
  for (uVar4 = 2; (ulong)uVar4 <= *local_8; uVar4 = uVar4 + 1) {
    fVar3 = *(float *)(local_8[2] + (ulong)(uVar4 - 1) * 0x20);
    pfVar2 = (float *)(local_8[2] + (ulong)(local_1ac - 1) * 0x20);
    if (*pfVar2 <= fVar3 && fVar3 != *pfVar2) {
      local_1ac = uVar4;
    }
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    for (fVar3 = 1.4013e-45; (ulong)(uint)fVar3 <= *local_8; fVar3 = (float)((int)fVar3 + 1)) {
      add_passthrough_feature_magic
                ((example *)CONCAT44(uVar5,in_stack_fffffffffffffe20),
                 CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                 CONCAT44(in_stack_fffffffffffffe14,uVar4),fVar3);
    }
  }
  *(uint *)(local_18 + 0x6850) = local_1ac;
  *(ulong *)(local_18 + 0x6828) = local_20;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}